

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O1

void __thiscall
MPL::detail::ModelPackageImpl::createItemInfoEntry
          (ModelPackageImpl *this,string *identifier,string *path,string *name,string *author,
          string *description)

{
  undefined1 *puVar1;
  undefined1 auVar2 [8];
  JsonMap *pJVar3;
  pointer __p;
  bool bVar4;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  undefined1 local_80 [8];
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string *local_38;
  
  local_48._8_8_ = description;
  local_38 = author;
  getItemInfoEntry((ModelPackageImpl *)local_80,(string *)this);
  if (local_80 == (undefined1  [8])0x0) {
    pJVar3 = (JsonMap *)operator_new(8);
    JsonMap::JsonMap(pJVar3);
    auVar2 = local_80;
    local_78._M_dataplus._M_p = (pointer)0x0;
    bVar4 = local_80 != (undefined1  [8])0x0;
    local_80 = (undefined1  [8])pJVar3;
    if (bVar4) {
      JsonMap::~JsonMap((JsonMap *)auVar2);
      operator_delete((void *)auVar2,8);
    }
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_80 + 8));
  }
  auVar2 = local_80;
  puVar1 = local_80 + 0x18;
  local_78._M_dataplus._M_p = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 8),"path","");
  JsonMap::setString((JsonMap *)auVar2,(string *)(local_80 + 8),path);
  if (local_78._M_dataplus._M_p != puVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._0_8_ + 1);
  }
  auVar2 = local_80;
  local_78._M_dataplus._M_p = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 8),"name","");
  JsonMap::setString((JsonMap *)auVar2,(string *)(local_80 + 8),name);
  if (local_78._M_dataplus._M_p != puVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._0_8_ + 1);
  }
  auVar2 = local_80;
  local_78._M_dataplus._M_p = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 8),"author","");
  JsonMap::setString((JsonMap *)auVar2,(string *)(local_80 + 8),local_38);
  if (local_78._M_dataplus._M_p != puVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._0_8_ + 1);
  }
  auVar2 = local_80;
  local_78._M_dataplus._M_p = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 8),"description","");
  JsonMap::setString((JsonMap *)auVar2,(string *)(local_80 + 8),(string *)local_48._8_8_);
  if (local_78._M_dataplus._M_p != puVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._0_8_ + 1);
  }
  getItemInfoEntries((ModelPackageImpl *)(local_80 + 0x28));
  local_48._M_allocated_capacity = (size_type)local_80;
  local_80 = (undefined1  [8])0x0;
  JsonMap::setObject((JsonMap *)local_58._0_8_,identifier,
                     (unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_58 + 0x10));
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_58 + 0x10));
  pJVar3 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
           _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
           super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  local_78._M_dataplus._M_p = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 8),"itemInfoEntries","");
  local_58._8_8_ = local_58._0_8_;
  local_58._0_8_ = (pointer)0x0;
  JsonMap::setObject(pJVar3,(string *)(local_80 + 8),
                     (unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_58 + 8));
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_58 + 8));
  if (local_78._M_dataplus._M_p != puVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._0_8_ + 1);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_80 + 0x28));
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_80);
  return;
}

Assistant:

void ModelPackageImpl::createItemInfoEntry(const std::string& identifier, const std::string& path, const std::string& name, const std::string& author, const std::string& description) {
    auto itemInfoEntry = getItemInfoEntry(identifier);
    
    if (nullptr == itemInfoEntry) {
        itemInfoEntry = std::make_unique<JsonMap>();
    }
    
    itemInfoEntry->setString(kModelPackageItemInfoPathKey, path);
    itemInfoEntry->setString(kModelPackageItemInfoNameKey, name);
    itemInfoEntry->setString(kModelPackageItemInfoAuthorKey, author);
    itemInfoEntry->setString(kModelPackageItemInfoDescriptionKey, description);
    
    auto itemInfoEntries = getItemInfoEntries();
    itemInfoEntries->setObject(identifier, std::move(itemInfoEntry));
    m_manifest->setObject(kModelPackageItemInfoEntriesKey, std::move(itemInfoEntries));
}